

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_value_numbering.h
# Opt level: O2

bool __thiscall
mocker::detail::ValueNumberTable::has(ValueNumberTable *this,shared_ptr<mocker::ir::Addr> *addr)

{
  bool bVar1;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> local_20;
  
  std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>(&local_20);
  if (local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = isIn<std::unordered_map<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>>,std::shared_ptr<mocker::ir::Reg>>
                      (&this->vn,(shared_ptr<mocker::ir::Reg> *)&local_20);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return bVar1;
}

Assistant:

bool has(const std::shared_ptr<ir::Addr> & addr) const {
    auto reg = ir::dyc<ir::Reg>(addr);
    if (!reg)
      return true;
    return isIn(vn, reg);
  }